

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::selection_statement(Parser *this)

{
  token_type tVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *this_00;
  string local_88;
  string local_68;
  string local_48;
  
  Lexer::next_token(this->lex);
  pNVar2 = expression(this);
  eat_abi_cxx11_(&local_48,this,LBRACE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pNVar3 = compound_statement(this);
  this_00 = (Node *)operator_new(0x48);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Node::Node(this_00,IF,pNVar2,pNVar3,&local_68,(Node *)0x0,(Node *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 == ELSE) {
    Lexer::next_token(this->lex);
    pNVar2 = compound_statement(this);
    pNVar3 = (Node *)operator_new(0x48);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    Node::Node(pNVar3,ELSE,pNVar2,(Node *)0x0,&local_88,(Node *)0x0,(Node *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    this_00->operand3 = pNVar3;
  }
  return this_00;
}

Assistant:

Node* Parser::selection_statement()
{
	lex->next_token();

	Node* expression_node = expression();

	eat(token_type::LBRACE);
	Node* compound_node = compound_statement();

	Node* selection_node = new Node(node_type::IF, expression_node, compound_node);

	if (tryEat(token_type::ELSE)) {
		lex->next_token();

		Node* compound_else_node = compound_statement();
		Node* else_node = new Node(node_type::ELSE, compound_else_node);
		selection_node->operand3 = else_node;
	}

	return selection_node;
}